

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkCollectCiNames(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  char *pcVar1;
  int i;
  
  p = Vec_PtrAlloc(100);
  for (i = 0; i < pNtk->vCis->nSize; i = i + 1) {
    pObj = Abc_NtkCi(pNtk,i);
    pcVar1 = Abc_ObjName(pObj);
    pcVar1 = Extra_UtilStrsav(pcVar1);
    Vec_PtrPush(p,pcVar1);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectCiNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_Ptr_t * vNames;
    vNames = Vec_PtrAlloc( 100 );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_PtrPush( vNames, Extra_UtilStrsav(Abc_ObjName(pObj)) );
    return vNames;
}